

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O1

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::findAllIntersections
          (Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
           *this,Node *node,
          vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
          *intersections)

{
  Node *pNVar1;
  pointer ppVar2;
  pointer ppVar3;
  Node *pNVar4;
  long lVar5;
  pointer ppVar6;
  long lVar7;
  Node *pNVar8;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *in_RCX;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *extraout_RDX;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *extraout_RDX_00;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *extraout_RDX_01;
  long lVar9;
  ulong uVar10;
  Node **value;
  ulong uVar11;
  Node *node_00;
  float fVar12;
  float fVar13;
  
  lVar9._0_4_ = this[1].mBox.width;
  lVar9._4_4_ = this[1].mBox.height;
  lVar5._0_4_ = this[1].mBox.left;
  lVar5._4_4_ = this[1].mBox.top;
  if (lVar9 != lVar5) {
    uVar11 = 0;
    do {
      if (uVar11 != 0) {
        lVar9 = 0;
        uVar10 = uVar11;
        do {
          intersections =
               *(vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> **)
                &this[1].mBox;
          ppVar6 = (&(intersections->
                     super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)[uVar11];
          pNVar1 = ppVar6->first;
          in_RCX = *(vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                     **)((long)&(intersections->
                                super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar9);
          ppVar2 = (in_RCX->
                   super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppVar3 = (in_RCX->
                   super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          fVar13 = SUB84(ppVar2,0);
          fVar12 = SUB84(pNVar1,0);
          if ((fVar12 < fVar13 + SUB84(ppVar3,0)) &&
             (pNVar4 = ppVar6->second, fVar13 < fVar12 + SUB84(pNVar4,0))) {
            fVar12 = (float)((ulong)ppVar2 >> 0x20);
            fVar13 = (float)((ulong)pNVar1 >> 0x20);
            if ((fVar13 < (float)((ulong)ppVar3 >> 0x20) + fVar12) &&
               (fVar12 < fVar13 + (float)((ulong)pNVar4 >> 0x20))) {
              std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
              emplace_back<Node*&,Node*&>
                        ((vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)
                         node,(Node **)(&(intersections->
                                         super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar11),
                         (Node **)((long)&(intersections->
                                          super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar9));
              intersections = extraout_RDX;
            }
          }
          lVar9 = lVar9 + 8;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(*(long *)&this[1].mBox.width - *(long *)&this[1].mBox >> 3));
  }
  lVar7._0_4_ = (this->mBox).left;
  lVar7._4_4_ = (this->mBox).top;
  if (lVar7 != 0) {
    lVar9 = 0;
    do {
      pNVar8 = *(Node **)&this[1].mBox.width;
      for (node_00 = *(Node **)&this[1].mBox; node_00 != pNVar8;
          node_00 = (Node *)((node_00->children)._M_elems + 1)) {
        findIntersectionsInDescendants
                  (*(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                     **)((long)&(this->mBox).left + lVar9),node_00,(Node **)node,in_RCX);
        intersections = extraout_RDX_00;
      }
      lVar9 = lVar9 + 8;
    } while (lVar9 != 0x20);
    lVar9 = 0;
    do {
      findAllIntersections
                (*(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                   **)((long)&(this->mBox).left + lVar9),node,intersections);
      lVar9 = lVar9 + 8;
      intersections = extraout_RDX_01;
    } while (lVar9 != 0x20);
  }
  return;
}

Assistant:

void findAllIntersections(Node* node, std::vector<std::pair<T, T>>& intersections) const
    {
        // Find intersections between values stored in this node
        // Make sure to not report the same intersection twice
        for (auto i = std::size_t(0); i < node->values.size(); ++i)
        {
            for (auto j = std::size_t(0); j < i; ++j)
            {
                if (mGetBox(node->values[i]).intersects(mGetBox(node->values[j])))
                    intersections.emplace_back(node->values[i], node->values[j]);
            }
        }
        if (!isLeaf(node))
        {
            // Values in this node can intersect values in descendants
            for (const auto& child : node->children)
            {
                for (const auto& value : node->values)
                    findIntersectionsInDescendants(child.get(), value, intersections);
            }
            // Find intersections in children
            for (const auto& child : node->children)
                findAllIntersections(child.get(), intersections);
        }
    }